

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O2

bool __thiscall capnp::anon_unknown_1::CapnpcCppMain::Slot::operator<(Slot *this,Slot other)

{
  Section SVar1;
  Section SVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  
  SVar1 = sectionFor(this->whichType);
  SVar2 = sectionFor(other.whichType);
  bVar7 = true;
  if (SVar2 <= SVar1) {
    if ((SVar2 < SVar1) || (SVar1 == NONE)) {
      bVar7 = false;
    }
    else if (SVar1 == POINTERS) {
      bVar7 = this->offset < other.offset;
    }
    else {
      uVar3 = typeSizeBits(this->whichType);
      uVar6 = this->offset * uVar3;
      uVar4 = typeSizeBits(other.whichType);
      uVar5 = other.offset * uVar4;
      if (uVar5 <= uVar6) {
        bVar7 = uVar4 < uVar3 && uVar6 <= uVar5;
      }
    }
  }
  return bVar7;
}

Assistant:

bool operator<(Slot other) const {
      // Sort by section, then start position, and finally size.

      auto section = sectionFor(whichType);
      auto otherSection = sectionFor(other.whichType);
      if (section < otherSection) {
        return true;
      } else if (section > otherSection) {
        return false;
      }

      switch (section) {
        case Section::NONE:
          return false;
        case Section::DATA: {
          auto bits = typeSizeBits(whichType);
          auto start = offset * bits;
          auto otherBits = typeSizeBits(other.whichType);
          auto otherStart = other.offset * otherBits;
          if (start < otherStart) {
            return true;
          } else if (start > otherStart) {
            return false;
          }

          // Sort larger sizes before smaller.
          return bits > otherBits;
        }
        case Section::POINTERS:
          return offset < other.offset;
      }
      KJ_UNREACHABLE;
    }